

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

bool fmt::v5::internal::grisu2_round
               (char *buf,int *size,int max_digits,uint64_t delta,uint64_t remainder,uint64_t exp,
               uint64_t diff,int *exp10)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = diff - remainder;
  if (exp <= delta - remainder && (remainder <= diff && uVar3 != 0)) {
    uVar2 = remainder + exp;
    uVar1 = delta - uVar2;
    do {
      if ((diff <= uVar2) && (uVar3 <= uVar2 - diff)) break;
      buf[(long)*size + -1] = buf[(long)*size + -1] + -1;
      bVar4 = exp <= uVar1;
      uVar1 = uVar1 - exp;
      if (diff <= uVar2) break;
      uVar3 = uVar3 - exp;
      uVar2 = uVar2 + exp;
    } while (bVar4);
  }
  if (max_digits < *size) {
    *size = *size + -1;
    *exp10 = *exp10 + 1;
    if ('4' < buf[*size]) {
      return false;
    }
  }
  return true;
}

Assistant:

FMT_FUNC bool grisu2_round(
    char *buf, int &size, int max_digits, uint64_t delta,
    uint64_t remainder, uint64_t exp, uint64_t diff, int &exp10) {
  while (remainder < diff && delta - remainder >= exp &&
        (remainder + exp < diff || diff - remainder > remainder + exp - diff)) {
    --buf[size - 1];
    remainder += exp;
  }
  if (size > max_digits) {
    --size;
    ++exp10;
    if (buf[size] >= '5')
      return false;
  }
  return true;
}